

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

bool __thiscall Map::Occupied(Map *this,uchar x,uchar y,OccupiedTarget target,bool adminghost)

{
  long lVar1;
  NPC *pNVar2;
  pointer ppNVar3;
  _List_node_base *p_Var4;
  byte bVar5;
  bool bVar6;
  
  bVar6 = false;
  if ((x < this->width) && (y < this->height)) {
    if (target == NPCOnly) {
LAB_0017a3dd:
      for (ppNVar3 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          (bVar6 = ppNVar3 !=
                   (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                   super__Vector_impl_data._M_finish, bVar6 &&
          (((pNVar2 = *ppNVar3, pNVar2->alive != true || (pNVar2->x != x)) || (pNVar2->y != y))));
          ppNVar3 = ppNVar3 + 1) {
      }
    }
    else {
      p_Var4 = (_List_node_base *)&this->characters;
      do {
        p_Var4 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var4->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var4 == (_List_node_base *)&this->characters) {
          if (target == PlayerOnly) {
            return false;
          }
          goto LAB_0017a3dd;
        }
        lVar1 = (long)p_Var4[1]._M_next;
        if (adminghost) {
          bVar5 = 1;
          if ((*(byte *)(lVar1 + 0xf4) & 4) == 0) {
            bVar5 = (*(byte *)(lVar1 + 0xf0) & 4) >> 2;
          }
        }
        else {
          bVar5 = 0;
        }
      } while ((*(uchar *)(lVar1 + 0xc0) != x) || (bVar5 != 0 || *(uchar *)(lVar1 + 0xc1) != y));
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool Map::Occupied(unsigned char x, unsigned char y, Map::OccupiedTarget target, bool adminghost) const
{
	if (!InBounds(x, y))
	{
		return false;
	}

	if (target != Map::NPCOnly)
	{
		UTIL_FOREACH(this->characters, character)
		{
			bool ghost = adminghost && (!character->CanInteractCombat() || character->IsHideNpc());

			if (character->x == x && character->y == y && !ghost)
			{
				return true;
			}
		}
	}

	if (target != Map::PlayerOnly)
	{
		UTIL_FOREACH(this->npcs, npc)
		{
			if (npc->alive && npc->x == x && npc->y == y)
			{
				return true;
			}
		}
	}

	return false;
}